

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O0

Sexp * AnalyzeShortCircuit(Sexp *form)

{
  bool bVar1;
  Sexp *pSVar2;
  JetRuntimeException *this;
  AndMeaning *this_00;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *pvVar3;
  OrMeaning *this_01;
  bool local_131;
  vector<Sexp_*,_std::allocator<Sexp_*>_> local_110;
  OrMeaning *local_f8;
  OrMeaning *meaning_1;
  vector<Sexp_*,_std::allocator<Sexp_*>_> local_e8;
  AndMeaning *local_d0;
  AndMeaning *meaning;
  function<void_(Sexp_*)> local_c0;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  tuple<bool&,std::_Swallow_assign_const&> local_78 [16];
  undefined1 local_68 [24];
  undefined1 local_50 [7];
  bool is_proper;
  vector<Sexp_*,_std::allocator<Sexp_*>_> args;
  FrameProtector __frame_prot;
  ContractFrameProtector local_20;
  ContractFrameProtector __contract_frame;
  Sexp *form_local;
  
  __contract_frame.protected_frame = (ContractFrame *)form;
  ContractFrameProtector::ContractFrameProtector(&local_20,"AnalyzeShortCircuit");
  bVar1 = Sexp::IsCons((Sexp *)__contract_frame.protected_frame);
  ContractFrameProtector::CheckPrecondition(&local_20,bVar1,"form->IsCons()");
  pSVar2 = Sexp::Car((Sexp *)__contract_frame.protected_frame);
  bVar1 = Sexp::IsSymbol(pSVar2);
  ContractFrameProtector::CheckPrecondition(&local_20,bVar1,"form->Car()->IsSymbol()");
  pSVar2 = Sexp::Car((Sexp *)__contract_frame.protected_frame);
  local_131 = true;
  if ((pSVar2->field_1).cons.car != (Sexp *)0xc) {
    pSVar2 = Sexp::Car((Sexp *)__contract_frame.protected_frame);
    local_131 = (pSVar2->field_1).cons.car == (Sexp *)0xd;
  }
  ContractFrameProtector::CheckPrecondition
            (&local_20,local_131,
             "form->Car()->symbol_value == SymbolInterner::And || form->Car()->symbol_value == SymbolInterner::Or"
            );
  FrameProtector::FrameProtector
            ((FrameProtector *)
             &args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"AnalyzeShortCircuit");
  FrameProtector::ProtectValue
            ((FrameProtector *)
             &args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Sexp **)&__contract_frame,"form");
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)local_50);
  FrameProtector::ProtectVector
            ((FrameProtector *)
             &args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<Sexp_*,_std::allocator<Sexp_*>_> *)local_50,"args");
  Sexp::Length((Sexp *)local_68);
  std::tie<bool,std::_Swallow_assign_const>((bool *)local_78,(_Swallow_assign *)(local_68 + 0x17));
  std::tuple<bool&,std::_Swallow_assign_const&>::operator=
            (local_78,(tuple<bool,_unsigned_long> *)local_68);
  if ((local_68[0x17] & 1) == 0) {
    local_9a = 1;
    this = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"invalid short-circuiting form",&local_99);
    JetRuntimeException::JetRuntimeException(this,(string *)local_98);
    local_9a = 0;
    __cxa_throw(this,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  pSVar2 = Sexp::Cdr((Sexp *)__contract_frame.protected_frame);
  meaning = (AndMeaning *)local_50;
  std::function<void(Sexp*)>::function<AnalyzeShortCircuit(Sexp*)::__0,void>
            ((function<void(Sexp*)> *)&local_c0,(anon_class_8_1_89897ddb *)&meaning);
  Sexp::ForEach(pSVar2,&local_c0);
  std::function<void_(Sexp_*)>::~function(&local_c0);
  pSVar2 = Sexp::Car((Sexp *)__contract_frame.protected_frame);
  if ((pSVar2->field_1).cons.car == (Sexp *)0xc) {
    this_00 = (AndMeaning *)operator_new(0x20);
    meaning_1._7_1_ = 1;
    std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
              (&local_e8,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)local_50);
    AndMeaning::AndMeaning(this_00,&local_e8);
    meaning_1._7_1_ = 0;
    std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector(&local_e8);
    local_d0 = this_00;
    pvVar3 = AndMeaning::Arguments(this_00);
    FrameProtector::ProtectVector
              ((FrameProtector *)
               &args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pvVar3,"meaning->Arguments()");
    form_local = GcHeap::AllocateMeaning(&local_d0->super_Meaning);
  }
  else {
    pSVar2 = Sexp::Car((Sexp *)__contract_frame.protected_frame);
    if ((pSVar2->field_1).cons.car != (Sexp *)0xd) {
      __assert_fail("form->Car()->symbol_value == SymbolInterner::Or",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp"
                    ,0x276,"Sexp *AnalyzeShortCircuit(Sexp *)");
    }
    this_01 = (OrMeaning *)operator_new(0x20);
    std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
              (&local_110,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)local_50);
    OrMeaning::OrMeaning(this_01,&local_110);
    std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector(&local_110);
    local_f8 = this_01;
    pvVar3 = OrMeaning::Arguments(this_01);
    FrameProtector::ProtectVector
              ((FrameProtector *)
               &args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pvVar3,"meaning->Arguments()");
    form_local = GcHeap::AllocateMeaning(&local_f8->super_Meaning);
  }
  meaning_1._0_4_ = 1;
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)local_50);
  FrameProtector::~FrameProtector
            ((FrameProtector *)
             &args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ContractFrameProtector::~ContractFrameProtector(&local_20);
  return form_local;
}

Assistant:

Sexp *AnalyzeShortCircuit(Sexp *form) {
  CONTRACT {
    PRECONDITION(form->IsCons());
    PRECONDITION(form->Car()->IsSymbol());
    PRECONDITION(form->Car()->symbol_value == SymbolInterner::And ||
                 form->Car()->symbol_value == SymbolInterner::Or);
  }